

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O1

S3DVertex * __thiscall irr::scene::SSkinMeshBuffer::getVertex(SSkinMeshBuffer *this,u32 index)

{
  ulong uVar1;
  
  uVar1 = (ulong)index;
  if (this->VertexType == EVT_TANGENTS) {
    return (S3DVertex *)(uVar1 * 0x3c + *(long *)&(this->super_IMeshBuffer).field_0x8);
  }
  if (this->VertexType == EVT_2TCOORDS) {
    return &(this->Vertices_2TCoords).m_data.
            super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar1].super_S3DVertex;
  }
  return (this->Vertices_Standard).m_data.
         super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
         super__Vector_impl_data._M_start + uVar1;
}

Assistant:

virtual video::S3DVertex *getVertex(u32 index)
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return (video::S3DVertex *)&Vertices_2TCoords[index];
		case video::EVT_TANGENTS:
			return (video::S3DVertex *)&Vertices_Tangents[index];
		default:
			return &Vertices_Standard[index];
		}
	}